

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O0

MSize lj_serialize_peektype(SBufExt *sbx)

{
  uint local_3c;
  SBufExt *pSStack_38;
  uint32_t tp;
  SBufExt *sbx_local;
  uint32_t *puStack_28;
  uint32_t v;
  byte *local_20;
  byte *local_18;
  byte *local_10;
  
  local_18 = (byte *)sbx->r;
  local_20 = (byte *)sbx->w;
  puStack_28 = &local_3c;
  if (local_18 < local_20) {
    local_3c = (uint)*local_18;
    local_18 = local_18 + 1;
    if (0xdf < local_3c) {
      pSStack_38 = sbx;
      sbx_local._4_4_ = local_3c;
      local_18 = (byte *)serialize_ru124_((char *)local_18,(char *)local_20,puStack_28);
    }
    local_10 = local_18;
  }
  else {
    local_10 = (byte *)0x0;
  }
  if (local_10 == (byte *)0x0) {
    sbx_local._0_4_ = 0;
  }
  else {
    switch(local_3c) {
    case 0:
      sbx_local._0_4_ = 0;
      break;
    case 1:
      sbx_local._0_4_ = 1;
      break;
    case 2:
      sbx_local._0_4_ = 2;
      break;
    case 3:
    case 4:
    case 5:
      sbx_local._0_4_ = 3;
      break;
    case 6:
      sbx_local._0_4_ = 0xe;
      break;
    case 7:
      sbx_local._0_4_ = 0xe;
      break;
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      sbx_local._0_4_ = 0xb;
      break;
    case 0xf:
    default:
      sbx_local._0_4_ = 4;
      break;
    case 0x10:
    case 0x11:
    case 0x12:
      sbx_local._0_4_ = 10;
    }
  }
  return (MSize)sbx_local;
}

Assistant:

LJ_FASTCALL lj_serialize_peektype(SBufExt *sbx)
{
  uint32_t tp;
  if (serialize_ru124(sbx->r, sbx->w, &tp)) {
    /* This must match the handling of all tags in the decoder above. */
    switch (tp) {
    case SER_TAG_NIL: return IRT_NIL;
    case SER_TAG_FALSE: return IRT_FALSE;
    case SER_TAG_TRUE: return IRT_TRUE;
    case SER_TAG_NULL: case SER_TAG_LIGHTUD32: case SER_TAG_LIGHTUD64:
      return IRT_LIGHTUD;
    case SER_TAG_INT: return LJ_DUALNUM ? IRT_INT : IRT_NUM;
    case SER_TAG_NUM: return IRT_NUM;
    case SER_TAG_TAB: case SER_TAG_TAB+1: case SER_TAG_TAB+2:
    case SER_TAG_TAB+3: case SER_TAG_TAB+4: case SER_TAG_TAB+5:
    case SER_TAG_DICT_MT:
      return IRT_TAB;
    case SER_TAG_INT64: case SER_TAG_UINT64: case SER_TAG_COMPLEX:
      return IRT_CDATA;
    case SER_TAG_DICT_STR:
    default:
      return IRT_STR;
    }
  }
  return IRT_NIL;  /* Will fail on actual decode. */
}